

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintTopLevelExtensions(Generator *this)

{
  long lVar1;
  Printer *pPVar2;
  AlphaNum *a;
  long lVar3;
  long lVar4;
  string constant_name;
  AlphaNum local_80;
  string local_50;
  
  lVar4 = 8;
  for (lVar3 = 0; lVar3 < *(int *)(this->file_ + 0x3c); lVar3 = lVar3 + 1) {
    lVar1 = *(long *)(this->file_ + 0x70);
    std::operator+(&constant_name,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar1 + lVar4),"_FIELD_NUMBER");
    UpperString(&constant_name);
    pPVar2 = this->printer_;
    strings::AlphaNum::AlphaNum(&local_80,*(int *)(lVar1 + -4 + lVar4));
    StrCat_abi_cxx11_(&local_50,(protobuf *)&local_80,a);
    io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
              (pPVar2,"$constant_name$ = $number$\n",(char (*) [14])0x3f0486,&constant_name,
               (char (*) [7])0x3f3265,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pPVar2 = this->printer_;
    anon_unknown_0::ResolveKeyword((string *)&local_80,*(string **)(lVar1 + lVar4));
    io::Printer::Print<char[14],std::__cxx11::string,char[5],char[11],char[5],std::__cxx11::string>
              (pPVar2,"$resolved_name$ = $file$.extensions_by_name[\'$name$\']\n",
               (char (*) [14])"resolved_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
               (char (*) [5])0x3d90fa,(char (*) [11])"DESCRIPTOR",(char (*) [5])0x3de831,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (lVar1 + lVar4));
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&constant_name);
    lVar4 = lVar4 + 0x48;
  }
  io::Printer::Print<>(this->printer_,"\n");
  return;
}

Assistant:

void Generator::PrintTopLevelExtensions() const {
  for (int i = 0; i < file_->extension_count(); ++i) {
    const FieldDescriptor& extension_field = *file_->extension(i);
    std::string constant_name = extension_field.name() + "_FIELD_NUMBER";
    ToUpper(&constant_name);
    printer_->Print("$constant_name$ = $number$\n", "constant_name",
                    constant_name, "number",
                    StrCat(extension_field.number()));
    printer_->Print(
        "$resolved_name$ = "
        "$file$.extensions_by_name['$name$']\n",
        "resolved_name", ResolveKeyword(extension_field.name()), "file",
        kDescriptorKey, "name", extension_field.name());
  }
  printer_->Print("\n");
}